

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pax_xattr_header.c
# Opt level: O0

void test_pax_xattr_header(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *paVar3;
  archive_entry *paVar4;
  la_ssize_t lVar5;
  archive_entry *ae;
  archive *a;
  
  extract_reference_files(test_pax_xattr_header::reffiles);
  paVar3 = (archive_conflict *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                   ,L';',(uint)(paVar3 != (archive_conflict *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_pax((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'<',0,"0",(long)iVar1,"archive_write_set_format_pax(a)",paVar3);
  iVar1 = archive_write_add_filter_none((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'=',0,"0",(long)iVar1,"archive_write_add_filter_none(a)",paVar3);
  wVar2 = archive_write_open_filename(paVar3,"test1.tar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'?',0,"0",(long)wVar2,"archive_write_open_filename(a, \"test1.tar\")",
                      (void *)0x0);
  paVar4 = create_archive_entry();
  iVar1 = archive_write_header((archive *)paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  archive_entry_free(paVar4);
  lVar5 = archive_write_data((archive *)paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'C',8,"8",lVar5,"archive_write_data(a, \"12345678\", 9)",paVar3);
  iVar1 = archive_write_close((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'F',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",paVar3);
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
             ,L'H',"test1.tar","test_pax_xattr_header_all.tar");
  paVar3 = (archive_conflict *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                   ,L'K',(uint)(paVar3 != (archive_conflict *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_pax((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'L',0,"0",(long)iVar1,"archive_write_set_format_pax(a)",paVar3);
  iVar1 = archive_write_add_filter_none((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'M',0,"0",(long)iVar1,"archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_set_options((archive *)paVar3,"xattrheader=SCHILY");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'O',0,"0",(long)iVar1,"archive_write_set_options(a, \"xattrheader=SCHILY\")"
                      ,paVar3);
  wVar2 = archive_write_open_filename(paVar3,"test2.tar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'Q',0,"0",(long)wVar2,"archive_write_open_filename(a, \"test2.tar\")",
                      (void *)0x0);
  paVar4 = create_archive_entry();
  iVar1 = archive_write_header((archive *)paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'T',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  archive_entry_free(paVar4);
  lVar5 = archive_write_data((archive *)paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'V',8,"8",lVar5,"archive_write_data(a, \"12345678\", 9)",paVar3);
  iVar1 = archive_write_close((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'X',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'Y',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",paVar3);
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
             ,L'[',"test2.tar","test_pax_xattr_header_schily.tar");
  paVar3 = (archive_conflict *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                   ,L'^',(uint)(paVar3 != (archive_conflict *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_pax((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'_',0,"0",(long)iVar1,"archive_write_set_format_pax(a)",paVar3);
  iVar1 = archive_write_add_filter_none((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'`',0,"0",(long)iVar1,"archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_set_options((archive *)paVar3,"xattrheader=LIBARCHIVE");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'b',0,"0",(long)iVar1,
                      "archive_write_set_options(a, \"xattrheader=LIBARCHIVE\")",paVar3);
  wVar2 = archive_write_open_filename(paVar3,"test3.tar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'd',0,"0",(long)wVar2,"archive_write_open_filename(a, \"test3.tar\")",
                      (void *)0x0);
  paVar4 = create_archive_entry();
  iVar1 = archive_write_header((archive *)paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'g',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  archive_entry_free(paVar4);
  lVar5 = archive_write_data((archive *)paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'i',8,"8",lVar5,"archive_write_data(a, \"12345678\", 9)",paVar3);
  iVar1 = archive_write_close((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'l',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",paVar3);
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
             ,L'n',"test3.tar","test_pax_xattr_header_libarchive.tar");
  paVar3 = (archive_conflict *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                   ,L'q',(uint)(paVar3 != (archive_conflict *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_pax((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'r',0,"0",(long)iVar1,"archive_write_set_format_pax(a)",paVar3);
  iVar1 = archive_write_add_filter_none((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L's',0,"0",(long)iVar1,"archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_set_options((archive *)paVar3,"xattrheader=ALL");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L't',0,"0",(long)iVar1,"archive_write_set_options(a, \"xattrheader=ALL\")",
                      paVar3);
  wVar2 = archive_write_open_filename(paVar3,"test4.tar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'v',0,"0",(long)wVar2,"archive_write_open_filename(a, \"test4.tar\")",
                      (void *)0x0);
  paVar4 = create_archive_entry();
  iVar1 = archive_write_header((archive *)paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'y',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  archive_entry_free(paVar4);
  lVar5 = archive_write_data((archive *)paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'{',8,"8",lVar5,"archive_write_data(a, \"12345678\", 9)",paVar3);
  iVar1 = archive_write_close((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'}',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
                      ,L'~',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",paVar3);
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_xattr_header.c"
             ,L'\x80',"test4.tar","test_pax_xattr_header_all.tar");
  return;
}

Assistant:

DEFINE_TEST(test_pax_xattr_header)
{
	static const char *reffiles[] = {
	    "test_pax_xattr_header_all.tar",
	    "test_pax_xattr_header_libarchive.tar",
	    "test_pax_xattr_header_schily.tar",
	    NULL
	};
	struct archive *a;
	struct archive_entry *ae;

	extract_reference_files(reffiles);

	/* First archive, no options */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, 0, archive_write_set_format_pax(a));
	assertEqualIntA(a, 0, archive_write_add_filter_none(a));
	assertEqualInt(0,
	    archive_write_open_filename(a, "test1.tar"));
	ae = create_archive_entry();
        assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
        archive_entry_free(ae);
        assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	assertEqualFile("test1.tar","test_pax_xattr_header_all.tar");

	/* Second archive, xattrheader=SCHILY */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, 0, archive_write_set_format_pax(a));
	assertEqualIntA(a, 0, archive_write_add_filter_none(a));
	assertEqualIntA(a, 0, archive_write_set_options(a,
	    "xattrheader=SCHILY")); 
	assertEqualInt(0,
	    archive_write_open_filename(a, "test2.tar"));

	ae = create_archive_entry();
        assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
        archive_entry_free(ae);
        assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	assertEqualFile("test2.tar","test_pax_xattr_header_schily.tar");

	/* Third archive, xattrheader=LIBARCHIVE */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, 0, archive_write_set_format_pax(a));
	assertEqualIntA(a, 0, archive_write_add_filter_none(a));
	assertEqualIntA(a, 0, archive_write_set_options(a,
	    "xattrheader=LIBARCHIVE")); 
	assertEqualInt(0,
	    archive_write_open_filename(a, "test3.tar"));

	ae = create_archive_entry();
        assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
        archive_entry_free(ae);
        assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	assertEqualFile("test3.tar","test_pax_xattr_header_libarchive.tar");

	/* Fourth archive, xattrheader=ALL */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, 0, archive_write_set_format_pax(a));
	assertEqualIntA(a, 0, archive_write_add_filter_none(a));
	assertEqualIntA(a, 0, archive_write_set_options(a, "xattrheader=ALL")); 
	assertEqualInt(0,
	    archive_write_open_filename(a, "test4.tar"));

	ae = create_archive_entry();
        assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
        archive_entry_free(ae);
        assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	assertEqualFile("test4.tar","test_pax_xattr_header_all.tar");
}